

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schematron.c
# Opt level: O0

void xmlSchematronFreeLets(xmlSchematronLetPtr_conflict lets)

{
  xmlSchematronLetPtr pxVar1;
  xmlSchematronLetPtr_conflict next;
  xmlSchematronLetPtr_conflict lets_local;
  
  next = lets;
  while (next != (xmlSchematronLetPtr_conflict)0x0) {
    pxVar1 = next->next;
    if (next->name != (xmlChar *)0x0) {
      (*xmlFree)(next->name);
    }
    if (next->comp != (xmlXPathCompExprPtr)0x0) {
      xmlXPathFreeCompExpr(next->comp);
    }
    (*xmlFree)(next);
    next = pxVar1;
  }
  return;
}

Assistant:

static void
xmlSchematronFreeLets(xmlSchematronLetPtr lets) {
    xmlSchematronLetPtr next;

    while (lets != NULL) {
        next = lets->next;
        if (lets->name != NULL)
            xmlFree(lets->name);
        if (lets->comp != NULL)
            xmlXPathFreeCompExpr(lets->comp);
        xmlFree(lets);
        lets = next;
    }
}